

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

void __thiscall
HighsHashTree<int,_HighsImplications::VarBound>::InnerLeaf<4>::rehash
          (InnerLeaf<4> *this,int hashPos)

{
  HighsHashTableEntry<int,_HighsImplications::VarBound> *pHVar1;
  HighsHashTableEntry<int,_HighsImplications::VarBound> *pHVar2;
  unsigned_long uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined4 uVar7;
  int iVar8;
  undefined4 uVar9;
  int iVar10;
  array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL> *paVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint64_t hash;
  ulong uVar15;
  int pos;
  int i;
  type entry;
  int local_50;
  int local_4c;
  undefined8 local_48;
  double dStack_40;
  double local_38;
  
  (this->occupation).occupation = 0;
  iVar10 = this->size;
  if (0 < (long)iVar10) {
    paVar11 = &this->entries;
    lVar13 = 0;
    uVar14 = 0;
    do {
      uVar15 = (ulong)(uint)paVar11->_M_elems[0].key_;
      uVar15 = (uVar15 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
               uVar15 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32) >>
               ((char)hashPos * -6 + 0x30U & 0x3f);
      (this->hashes)._M_elems[lVar13] = uVar15 & 0xffff;
      uVar14 = uVar14 | 1L << (uVar15 >> 10 & 0x3f);
      lVar13 = lVar13 + 1;
      paVar11 = (array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL> *)
                (paVar11->_M_elems + 1);
    } while (iVar10 != lVar13);
    (this->occupation).occupation = uVar14;
    local_4c = 0;
    if (0 < iVar10) {
      iVar10 = 0;
      do {
        lVar12 = (long)iVar10;
        uVar14 = (this->hashes)._M_elems[lVar12];
        lVar13 = POPCOUNT((this->occupation).occupation >> ((byte)(uVar14 >> 10) & 0x3f));
        local_50 = (int)lVar13 + -1;
        if (iVar10 < local_50) {
          uVar3 = (this->hashes)._M_elems[local_50];
          (this->hashes)._M_elems[local_50] = uVar14;
          (this->hashes)._M_elems[lVar12] = uVar3;
          dVar4 = (this->entries)._M_elems[local_50].value_.constant;
          pHVar1 = (this->entries)._M_elems + local_50;
          iVar8 = pHVar1->key_;
          uVar9 = *(undefined4 *)&pHVar1->field_0x4;
          dVar5 = (pHVar1->value_).coef;
          (this->entries)._M_elems[local_50].value_.constant =
               (this->entries)._M_elems[lVar12].value_.constant;
          pHVar1 = (this->entries)._M_elems + lVar12;
          uVar7 = *(undefined4 *)&pHVar1->field_0x4;
          dVar6 = (pHVar1->value_).coef;
          pHVar2 = (this->entries)._M_elems + local_50;
          pHVar2->key_ = pHVar1->key_;
          *(undefined4 *)&pHVar2->field_0x4 = uVar7;
          (pHVar2->value_).coef = dVar6;
          (this->entries)._M_elems[lVar12].value_.constant = dVar4;
          pHVar1 = (this->entries)._M_elems + lVar12;
          pHVar1->key_ = iVar8;
          *(undefined4 *)&pHVar1->field_0x4 = uVar9;
          (pHVar1->value_).coef = dVar5;
        }
        else {
          if ((int)lVar13 <= iVar10) {
            do {
              if ((this->hashes)._M_elems[lVar13 + -1] < uVar14) {
                local_38 = (this->entries)._M_elems[lVar12].value_.constant;
                pHVar1 = (this->entries)._M_elems + lVar12;
                local_48 = *(undefined8 *)pHVar1;
                dStack_40 = (pHVar1->value_).coef;
                move_backward(this,&local_50,&local_4c);
                lVar13 = (long)local_50;
                (this->hashes)._M_elems[lVar13] = uVar14;
                (this->entries)._M_elems[lVar13].value_.constant = local_38;
                pHVar1 = (this->entries)._M_elems + lVar13;
                *(undefined8 *)pHVar1 = local_48;
                (pHVar1->value_).coef = dStack_40;
                iVar10 = local_4c;
                break;
              }
              local_50 = (int)lVar13;
              lVar13 = lVar13 + 1;
            } while (lVar12 + 1 != lVar13);
          }
          iVar10 = iVar10 + 1;
          local_4c = iVar10;
        }
      } while (iVar10 < this->size);
    }
  }
  return;
}

Assistant:

void rehash(int hashPos) {
      // function needs to possibly reorder elements by a different hash value
      // chances are very high we are already ordered correctly as we use 16
      // bits of the hash and one level is uses 6 bits, so the new values
      // are guaranteed to be ordered correctly by their 10 most significant
      // bits if increasing the hash position by 1 and only if the 10 bits of
      // the hash had a collision the new 6 bits might break a tie differently.
      // It is, however, important to maintain the exact ordering as otherwise
      // elements may not be found.
      occupation = 0;
      for (int i = 0; i < size; ++i) {
        hashes[i] = get_hash_chunks16(compute_hash(entries[i].key()), hashPos);
        occupation.set(get_first_chunk16(hashes[i]));
      }

      int i = 0;
      while (i < size) {
        uint8_t hashChunk = get_first_chunk16(hashes[i]);
        int pos = occupation.num_set_until(hashChunk) - 1;

        // if the position is after i the element definitely comes later, so we
        // swap it to that position and proceed without increasing i until
        // eventually an element appears that comes at position i or before
        if (pos > i) {
          std::swap(hashes[pos], hashes[i]);
          std::swap(entries[pos], entries[i]);
          continue;
        }

        // the position is before or at i, now check where the exact location
        // should be for the ordering by hash so that the invariant is that all
        // elements up to i are properly sorted. Essentially insertion sort but
        // with the modification of having a high chance to guess the correct
        // position already using the occupation flags.
        while (pos < i && hashes[pos] >= hashes[i]) ++pos;

        // if the final position is before i we need to move elements to
        // make space at that position, otherwise nothing needs to be done but
        // incrementing i increasing the sorted range by 1.
        if (pos < i) {
          uint64_t hash = hashes[i];
          auto entry = std::move(entries[i]);
          move_backward(pos, i);
          hashes[pos] = hash;
          entries[pos] = std::move(entry);
        }
        ++i;
      }
    }